

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCommandBuffersTests.cpp
# Opt level: O3

void vkt::api::anon_unknown_0::genComputeSource(SourceCollections *programCollection)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *__s;
  size_t sVar2;
  ProgramSources *pPVar3;
  ostringstream bufBad;
  ostringstream bufGood;
  string local_388;
  undefined1 local_368 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_358;
  long *local_340;
  long local_338;
  long local_330 [2];
  uint local_320;
  undefined4 uStack_31c;
  value_type local_318 [3];
  ios_base local_2b0 [264];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  __s = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  if (__s == (char *)0x0) {
    std::ios::clear((int)&local_388 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x1e0);
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"",0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "layout(local_size_x = 1u, local_size_y = 1u, local_size_z = 1u) in;\n",0x44);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(set = 0, binding = 1u, std140) uniform BufferName\n",0x39)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\thighp vec4 colorA;\n",0x14);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\thighp vec4 colorB;\n",0x14);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"} b_instance;\n",0xe);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(set = 0, binding = 0, std140) writeonly buffer OutBuf\n",
             0x3d);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\thighp vec4 read_colors[4];\n",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"} b_out;\n",9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"void main(void)\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\thighp int quadrant_id = int(gl_WorkGroupID.x);\n",0x30);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\thighp vec4 result_color;\n",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\tif (quadrant_id == 1 || quadrant_id == 2)\n",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\t\tresult_color = b_instance.colorA;\n",0x24);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\telse\n",6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\t\tresult_color = b_instance.colorB;\n",0x24);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\tb_out.read_colors[gl_WorkGroupID.x] = result_color;\n",0x35);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  local_368._0_8_ = &local_358;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"compute_good","");
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,(string *)local_368);
  std::__cxx11::stringbuf::str();
  local_320 = 5;
  local_318[0]._M_dataplus._M_p = (pointer)&local_318[0].field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_318,local_388._M_dataplus._M_p,
             local_388._M_dataplus._M_p + local_388._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar3->sources + local_320,local_318);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318[0]._M_dataplus._M_p != &local_318[0].field_2) {
    operator_delete(local_318[0]._M_dataplus._M_p,local_318[0].field_2._M_allocated_capacity + 1);
  }
  paVar1 = &local_388.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != paVar1) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._0_8_ != &local_358) {
    operator_delete((void *)local_368._0_8_,local_358._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_320);
  if (__s == (char *)0x0) {
    std::ios::clear((int)&local_388 + (int)*(undefined8 *)(CONCAT44(uStack_31c,local_320) + -0x18) +
                    0x68);
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_320,__s,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_320,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_320,"",0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_320,
             "layout(local_size_x = 1u, local_size_y = 1u, local_size_z = 1u) in;\n",0x44);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_320,"layout(set = 0, binding = 1u, std140) uniform BufferName\n",0x39
            );
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_320,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_320,"\thighp vec4 colorA;\n",0x14);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_320,"\thighp vec4 colorB;\n",0x14);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_320,"} b_instance;\n",0xe);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_320,"layout(set = 0, binding = 0, std140) writeonly buffer OutBuf\n",
             0x3d);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_320,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_320,"\thighp vec4 read_colors[4];\n",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_320,"} b_out;\n",9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_320,"void main(void)\n",0x10)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_320,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_320,"\thighp int quadrant_id = int(gl_WorkGroupID.x);\n",0x30);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_320,"\thighp vec4 result_color;\n",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_320,"\tif (quadrant_id == 1 || quadrant_id == 2)\n",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_320,"\t\tresult_color = b_instance.colorA;\n",0x24);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_320,"\telse\n",6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_320,"\t\tresult_color = b_instance.colorB;\n",0x24);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_320,
             "\tb_out.read_colors[gl_WorkGroupID.x] = vec4(0.0, 0.0, 0.0, 0.0);\n",0x41);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_320,"}\n",2);
  local_388._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"compute_bad","");
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_388);
  std::__cxx11::stringbuf::str();
  local_368._0_4_ = 5;
  local_368._8_8_ = local_358._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_368 + 8),local_340,local_338 + (long)local_340);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar3->sources + (local_368._0_8_ & 0xffffffff),(value_type *)(local_368 + 8));
  if ((char *)local_368._8_8_ != local_358._M_local_buf + 8) {
    operator_delete((void *)local_368._8_8_,local_358._8_8_ + 1);
  }
  if (local_340 != local_330) {
    operator_delete(local_340,local_330[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != paVar1) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_320);
  std::ios_base::~ios_base(local_2b0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void genComputeSource (SourceCollections& programCollection)
{
	const char* const						versionDecl				= glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES);
	std::ostringstream						bufGood;

	bufGood << versionDecl << "\n"
	<< ""
	<< "layout(local_size_x = 1u, local_size_y = 1u, local_size_z = 1u) in;\n"
	<< "layout(set = 0, binding = 1u, std140) uniform BufferName\n"
	<< "{\n"
	<< "	highp vec4 colorA;\n"
	<< "	highp vec4 colorB;\n"
	<< "} b_instance;\n"
	<< "layout(set = 0, binding = 0, std140) writeonly buffer OutBuf\n"
	<< "{\n"
	<< "	highp vec4 read_colors[4];\n"
	<< "} b_out;\n"
	<< "void main(void)\n"
	<< "{\n"
	<< "	highp int quadrant_id = int(gl_WorkGroupID.x);\n"
	<< "	highp vec4 result_color;\n"
	<< "	if (quadrant_id == 1 || quadrant_id == 2)\n"
	<< "		result_color = b_instance.colorA;\n"
	<< "	else\n"
	<< "		result_color = b_instance.colorB;\n"
	<< "	b_out.read_colors[gl_WorkGroupID.x] = result_color;\n"
	<< "}\n";

	programCollection.glslSources.add("compute_good") << glu::ComputeSource(bufGood.str());

	std::ostringstream	bufBad;

	bufBad	<< versionDecl << "\n"
	<< ""
	<< "layout(local_size_x = 1u, local_size_y = 1u, local_size_z = 1u) in;\n"
	<< "layout(set = 0, binding = 1u, std140) uniform BufferName\n"
	<< "{\n"
	<< "	highp vec4 colorA;\n"
	<< "	highp vec4 colorB;\n"
	<< "} b_instance;\n"
	<< "layout(set = 0, binding = 0, std140) writeonly buffer OutBuf\n"
	<< "{\n"
	<< "	highp vec4 read_colors[4];\n"
	<< "} b_out;\n"
	<< "void main(void)\n"
	<< "{\n"
	<< "	highp int quadrant_id = int(gl_WorkGroupID.x);\n"
	<< "	highp vec4 result_color;\n"
	<< "	if (quadrant_id == 1 || quadrant_id == 2)\n"
	<< "		result_color = b_instance.colorA;\n"
	<< "	else\n"
	<< "		result_color = b_instance.colorB;\n"
	<< "	b_out.read_colors[gl_WorkGroupID.x] = vec4(0.0, 0.0, 0.0, 0.0);\n"
	<< "}\n";

	programCollection.glslSources.add("compute_bad") << glu::ComputeSource(bufBad.str());
}